

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

value_type __thiscall
andres::
BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
::operator()(BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
             *this,size_t c0,size_t c1,size_t c2)

{
  View<int,_false,_std::allocator<unsigned_long>_> *this_00;
  pointer piVar1;
  value_type vVar2;
  size_t sVar3;
  size_t sVar4;
  runtime_error *this_01;
  
  vVar2 = BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
          ::operator()(this->e1_,c0,c1,c2);
  this_00 = this->e2_;
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(this_00);
  piVar1 = this_00->data_;
  if ((piVar1 != (pointer)0x0) && ((this_00->geometry_).dimension_ == 3)) {
    sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::strides(this_00,0);
    sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::elementAccessHelper<unsigned_long>
                      (this_00,3,c1,c2);
    return vVar2 * piVar1[sVar3 * c0 + sVar4];
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"Assertion failed.");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const value_type operator()(const std::size_t c0, const std::size_t c1, const std::size_t c2) const 
        { return binaryFunctor_(e1_(c0, c1, c2), e2_(c0, c1, c2)); }